

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_node * ly_ctx_get_node(ly_ctx *ctx,lys_node *start,char *nodeid)

{
  LY_ERR *pLVar1;
  lys_node *node;
  char *nodeid_local;
  lys_node *start_local;
  ly_ctx *ctx_local;
  
  if (((ctx == (ly_ctx *)0x0) || (nodeid == (char *)0x0)) ||
     ((*nodeid != '/' && (start == (lys_node *)0x0)))) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    ctx_local = (ly_ctx *)resolve_json_nodeid(nodeid,ctx,start);
  }
  return (lys_node *)ctx_local;
}

Assistant:

lys_node *
ly_ctx_get_node(struct ly_ctx *ctx, const struct lys_node *start, const char *nodeid)
{
    const struct lys_node *node;

    if (!ctx || !nodeid || ((nodeid[0] != '/') && !start)) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    /* sets error and everything */
    node = resolve_json_nodeid(nodeid, ctx, start);

    return node;
}